

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O2

CURLSH * curl_share_init(void)

{
  CURLSH *pCVar1;
  
  pCVar1 = (CURLSH *)(*Curl_ccalloc)(1,0xd0);
  if (pCVar1 != (CURLSH *)0x0) {
    pCVar1->magic = 0x7e117a1e;
    *(byte *)&pCVar1->specifier = (byte)pCVar1->specifier | 2;
    Curl_init_dnscache(&pCVar1->hostcache,0x17);
  }
  return pCVar1;
}

Assistant:

struct Curl_share *
curl_share_init(void)
{
  struct Curl_share *share = calloc(1, sizeof(struct Curl_share));
  if(share) {
    share->magic = CURL_GOOD_SHARE;
    share->specifier |= (1<<CURL_LOCK_DATA_SHARE);
    Curl_init_dnscache(&share->hostcache, 23);
  }

  return share;
}